

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf-ctest.c
# Opt level: O3

void test31(char *infile,char *password,char *outfile,char *xarg)

{
  undefined4 uVar1;
  int iVar2;
  long lVar3;
  undefined8 uVar4;
  
  qpdf_read(qpdf,infile,password);
  uVar1 = qpdf_get_trailer(qpdf);
  lVar3 = qpdf_oh_get_int_value(qpdf,uVar1);
  if (lVar3 != 0) {
    __assert_fail("qpdf_oh_get_int_value(qpdf, trailer) == 0LL",
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/qpdf-ctest.c",
                  0x3bd,"void test31(const char *, const char *, const char *, const char *)");
  }
  iVar2 = qpdf_has_error(qpdf);
  if (iVar2 != 0) {
    __assert_fail("!qpdf_has_error(qpdf)",
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/qpdf-ctest.c",
                  0x3be,"void test31(const char *, const char *, const char *, const char *)");
  }
  iVar2 = qpdf_more_warnings(qpdf);
  if (iVar2 == 0) {
    __assert_fail("qpdf_more_warnings(qpdf)",
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/qpdf-ctest.c",
                  0x3bf,"void test31(const char *, const char *, const char *, const char *)");
  }
  uVar4 = qpdf_next_warning(qpdf);
  iVar2 = qpdf_get_error_code(qpdf,uVar4);
  if (iVar2 == 7) {
    report_errors();
    return;
  }
  __assert_fail("qpdf_get_error_code(qpdf, e) == qpdf_e_object",
                "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/qpdf-ctest.c",
                0x3c1,"void test31(const char *, const char *, const char *, const char *)");
}

Assistant:

static void
test31(char const* infile, char const* password, char const* outfile, char const* xarg)
{
    /* Make sure type warnings have a specific error code. This test
     * case is designed for minimal.pdf.
     */
    qpdf_read(qpdf, infile, password);
    qpdf_oh trailer = qpdf_get_trailer(qpdf);
    assert(qpdf_oh_get_int_value(qpdf, trailer) == 0LL);
    assert(!qpdf_has_error(qpdf));
    assert(qpdf_more_warnings(qpdf));
    qpdf_error e = qpdf_next_warning(qpdf);
    assert(qpdf_get_error_code(qpdf, e) == qpdf_e_object);
    report_errors();
}